

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O2

_Bool al_play_sample(ALLEGRO_SAMPLE *spl,float gain,float pan,float speed,ALLEGRO_PLAYMODE loop,
                    ALLEGRO_SAMPLE_ID *ret_id)

{
  ALLEGRO_SAMPLE_INSTANCE *spl_00;
  _Bool _Var1;
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (ret_id != (ALLEGRO_SAMPLE_ID *)0x0) {
    ret_id->_index = 0;
    ret_id->_id = -1;
  }
  uVar5 = 0;
  while( true ) {
    if (auto_samples._size <= uVar5) {
      return false;
    }
    puVar4 = (undefined8 *)_al_vector_ref(&auto_samples,uVar5);
    _Var1 = al_get_sample_instance_playing((ALLEGRO_SAMPLE_INSTANCE *)*puVar4);
    if ((!_Var1) && (*(char *)((long)puVar4 + 0xc) == '\0')) break;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  spl_00 = (ALLEGRO_SAMPLE_INSTANCE *)*puVar4;
  _Var1 = al_set_sample(spl_00,spl);
  if (_Var1) {
    _Var1 = al_set_sample_instance_gain(spl_00,gain);
    if (!_Var1) {
      return false;
    }
    _Var1 = al_set_sample_instance_pan(spl_00,pan);
    if (!_Var1) {
      return false;
    }
    _Var1 = al_set_sample_instance_speed(spl_00,speed);
    if (!_Var1) {
      return false;
    }
    _Var1 = al_set_sample_instance_playmode(spl_00,loop);
    if (!_Var1) {
      return false;
    }
    _Var1 = al_play_sample_instance(spl_00);
    if (_Var1) {
      if (ret_id != (ALLEGRO_SAMPLE_ID *)0x0) {
        ret_id->_index = (int)uVar5;
        iVar3 = al_play_sample::next_id + 1;
        al_play_sample::next_id = iVar3;
        *(int *)(puVar4 + 1) = iVar3;
        ret_id->_id = iVar3;
        return true;
      }
      return true;
    }
    cVar2 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                             ,0x187,"do_play_sample");
    if (cVar2 == '\0') {
      return false;
    }
    pcVar6 = "al_play_sample_instance failed\n";
  }
  else {
    cVar2 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                             ,0x17b,"do_play_sample");
    if (cVar2 == '\0') {
      return false;
    }
    pcVar6 = "al_set_sample failed\n";
  }
  _al_trace_suffix(pcVar6);
  return false;
}

Assistant:

bool al_play_sample(ALLEGRO_SAMPLE *spl, float gain, float pan, float speed,
   ALLEGRO_PLAYMODE loop, ALLEGRO_SAMPLE_ID *ret_id)
{
   static int next_id = 0;
   unsigned int i;
   
   ASSERT(spl);

   if (ret_id != NULL) {
      ret_id->_id = -1;
      ret_id->_index = 0;
   }

   for (i = 0; i < _al_vector_size(&auto_samples); i++) {
      AUTO_SAMPLE *slot = _al_vector_ref(&auto_samples, i);

      if (!al_get_sample_instance_playing(slot->instance) && !slot->locked) {
         if (!do_play_sample(slot->instance, spl, gain, pan, speed, loop))
            break;

         if (ret_id != NULL) {
            ret_id->_index = (int) i;
            ret_id->_id = slot->id = ++next_id;
         }

         return true;
      }
   }

   return false;
}